

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflow.cpp
# Opt level: O1

vector<int,_std::allocator<int>_> * __thiscall
Arcflow::hash(vector<int,_std::allocator<int>_> *__return_storage_ptr__,Arcflow *this,
             vector<int,_std::allocator<int>_> *su)

{
  iterator __position;
  uint *puVar1;
  byte bVar2;
  int iVar3;
  pointer piVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  int local_3c;
  Arcflow *local_38;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = this;
  std::vector<int,_std::allocator<int>_>::reserve(__return_storage_ptr__,(long)hash::last_size);
  piVar4 = (su->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if (0 < (int)((ulong)((long)(su->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar4) >> 2)) {
    lVar8 = 0;
    puVar1 = (uint *)0x0;
    iVar5 = 0;
    do {
      iVar6 = (local_38->hash_bits).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar8];
      if (iVar6 != 0) {
        uVar9 = piVar4[lVar8];
        do {
          if (iVar5 == 0) {
            local_3c = 0;
            __position._M_current =
                 (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (__return_storage_ptr__,__position,&local_3c);
            }
            else {
              *__position._M_current = 0;
              (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
            puVar1 = (uint *)((__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>
                              )._M_impl.super__Vector_impl_data._M_finish + -1);
            iVar5 = 0x20;
          }
          iVar3 = iVar6;
          if (iVar5 < iVar6) {
            iVar3 = iVar5;
          }
          bVar2 = (byte)iVar3;
          uVar7 = ~(-1 << (bVar2 & 0x1f)) & uVar9;
          uVar9 = (int)uVar9 >> (bVar2 & 0x1f);
          *puVar1 = uVar7 | *puVar1 << (bVar2 & 0x1f);
          iVar5 = iVar5 - iVar3;
          iVar6 = iVar6 - iVar3;
        } while (iVar6 != 0);
      }
      lVar8 = lVar8 + 1;
      piVar4 = (su->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_start;
    } while (lVar8 < (int)((ulong)((long)(su->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                         .super__Vector_impl_data._M_finish - (long)piVar4) >> 2));
  }
  hash::last_size =
       (int)((ulong)((long)(__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>).
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>).
                          _M_impl.super__Vector_impl_data._M_start) >> 2);
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<int> Arcflow::hash(const std::vector<int> &su) {
	static int last_size = 1;
	std::vector<int> h;
	h.reserve(last_size);
	int *p = NULL, dst_bits = 0;
	for (int i = 0; i < static_cast<int>(su.size()); i++) {
		int x = su[i];
		int src_bits = hash_bits[i];
		while (src_bits != 0) {
			if (dst_bits == 0) {
				h.push_back(0);
				p = &h.back();
				dst_bits = sizeof(int) * 8;
			}
			int window_width = std::min(src_bits, dst_bits);
			*p <<= window_width;
			*p |= x & ((1u << window_width) - 1);
			x >>= window_width;
			src_bits -= window_width;
			dst_bits -= window_width;
		}
	}
	last_size = h.size();
	return h;
}